

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O1

void __thiscall xray_re::cse_abstract::cse_abstract(cse_abstract *this)

{
  this->_vptr_cse_abstract = (_func_int **)&PTR__cse_abstract_002458e0;
  (this->m_s_name_replace)._M_dataplus._M_p = (pointer)&(this->m_s_name_replace).field_2;
  (this->m_s_name_replace)._M_string_length = 0;
  (this->m_s_name_replace).field_2._M_local_buf[0] = '\0';
  this->m_version = 0;
  this->m_script_version = 0;
  this->m_respawn_time = 0;
  this->m_id = 0xffff;
  this->m_id_parent = 0xffff;
  this->m_id_phantom = 0xffff;
  (this->m_s_name)._M_dataplus._M_p = (pointer)&(this->m_s_name).field_2;
  (this->m_s_name)._M_string_length = 0;
  (this->m_s_name).field_2._M_local_buf[0] = '\0';
  this->m_s_game_id = '\0';
  this->m_s_rp = 0xfe;
  this->m_s_flags = 0;
  this->m_cs_unk1_u16 = 0xffff;
  (this->m_ini_string)._M_dataplus._M_p = (pointer)&(this->m_ini_string).field_2;
  (this->m_ini_string)._M_string_length = 0;
  (this->m_ini_string).field_2._M_local_buf[0] = '\0';
  this->m_spawn_id = 0xffff;
  (this->m_clsid).field_0.quad = 0;
  (this->m_markers).c.
  super__Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_markers).c.
  super__Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->m_markers).c.
  super__Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_markers).c.
  super__Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_markers).c.
  super__Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_markers).c.
  super__Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_markers).c.
  super__Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_markers).c.
  super__Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_markers).c.
  super__Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_markers).c.
  super__Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>::
  _M_initialize_map((_Deque_base<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>
                     *)&this->m_markers,0);
  *(undefined8 *)&(this->m_o_position).field_0 = 0;
  *(undefined8 *)((long)&(this->m_o_position).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->m_o_angle).field_0 + 4) = 0;
  return;
}

Assistant:

cse_abstract::cse_abstract():
	m_version(0), m_script_version(0), m_respawn_time(0),
	m_id(UNDEF16), m_id_parent(UNDEF16), m_id_phantom(UNDEF16),
	m_s_game_id(GAME_ANY), m_s_rp(0xfe), m_s_flags(0),
	m_cs_unk1_u16(UNDEF16),
	m_spawn_id(UNDEF16)
{
	m_o_position.set();
	m_o_angle.set();
}